

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O2

void __thiscall
RGBUnboundedSpectrum_MaxValue_Test::TestBody(RGBUnboundedSpectrum_MaxValue_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Message *message;
  long lVar3;
  int iVar4;
  char *message_00;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar8 [64];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  float local_27c;
  float local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  AssertHelper local_260;
  AssertionResult gtest_ar;
  RGB local_228;
  RNG rng;
  RGBUnboundedSpectrum rs;
  RGBColorSpace local_1f8 [3];
  undefined1 extraout_var [60];
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  pbrt::RGBColorSpace::RGBColorSpace(local_1f8,pbrt::RGBColorSpace::sRGB);
  pbrt::RGBColorSpace::RGBColorSpace(local_1f8 + 1,pbrt::RGBColorSpace::Rec2020);
  pbrt::RGBColorSpace::RGBColorSpace(local_1f8 + 2,pbrt::RGBColorSpace::ACES2065_1);
  for (lVar3 = 0; lVar3 != 0x1c8; lVar3 = lVar3 + 0x98) {
    for (iVar4 = 0; iVar4 != 100; iVar4 = iVar4 + 1) {
      local_278 = pbrt::RNG::Uniform<float>(&rng);
      uStack_274 = extraout_XMM0_Db;
      uStack_270 = extraout_XMM0_Dc;
      uStack_26c = extraout_XMM0_Dd;
      fVar6 = pbrt::RNG::Uniform<float>(&rng);
      local_228.b = pbrt::RNG::Uniform<float>(&rng);
      auVar5._4_4_ = uStack_274;
      auVar5._0_4_ = local_278;
      auVar5._8_4_ = uStack_270;
      auVar5._12_4_ = uStack_26c;
      local_228.b = local_228.b * 10.0;
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar6),0x10);
      auVar1._8_4_ = 0x41200000;
      auVar1._0_8_ = 0x4120000041200000;
      auVar1._12_4_ = 0x41200000;
      auVar5 = vmulps_avx512vl(auVar5,auVar1);
      local_228._0_8_ = vmovlps_avx(auVar5);
      pbrt::RGBUnboundedSpectrum::RGBUnboundedSpectrum
                (&rs,(RGBColorSpace *)
                     ((long)&(((RGBColorSpace *)(&local_1f8[0].XYZFromRGB + -2))->r).
                             super_Tuple2<pbrt::Point2,_float>.x + lVar3),&local_228);
      local_27c = pbrt::RGBUnboundedSpectrum::MaxValue(&rs);
      local_278 = 0.0;
      for (fVar6 = 360.0; fVar6 <= 830.0; fVar6 = fVar6 + 0.0625) {
        auVar8._0_4_ = pbrt::RGBUnboundedSpectrum::operator()(&rs,fVar6);
        auVar8._4_60_ = extraout_var;
        auVar5 = vmaxss_avx(auVar8._0_16_,ZEXT416((uint)local_278));
        local_278 = auVar5._0_4_;
      }
      local_288.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0x3f1a36e2eb1c432d;
      auVar7._0_4_ = (local_278 - local_27c) / local_278;
      auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar2._8_4_ = 0x7fffffff;
      auVar2._0_8_ = 0x7fffffff7fffffff;
      auVar2._12_4_ = 0x7fffffff;
      auVar5 = vandps_avx512vl(auVar7,auVar2);
      local_260.data_._0_4_ = auVar5._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar,"std::abs((sm - m) / sm)","1e-4",(float *)&local_260,
                 (double *)&local_288);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_288);
        std::operator<<((ostream *)(local_288.ptr_ + 0x10),"sampled ");
        std::ostream::operator<<(local_288.ptr_ + 0x10,local_278);
        std::operator<<((ostream *)(local_288.ptr_ + 0x10)," MaxValue ");
        std::ostream::operator<<(local_288.ptr_ + 0x10,local_27c);
        std::operator<<((ostream *)(local_288.ptr_ + 0x10)," for ");
        message = testing::Message::operator<<((Message *)&local_288,&rs);
        message_00 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message_00 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_260,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
                   ,0x68,message_00);
        testing::internal::AssertHelper::operator=(&local_260,message);
        testing::internal::AssertHelper::~AssertHelper(&local_260);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_288);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
  }
  lVar3 = 0x158;
  do {
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               ((long)&(((RGBColorSpace *)(&local_1f8[0].XYZFromRGB + -2))->r).
                       super_Tuple2<pbrt::Point2,_float>.x + lVar3));
    lVar3 = lVar3 + -0x98;
  } while (lVar3 != -0x70);
  return;
}

Assistant:

TEST(RGBUnboundedSpectrum, MaxValue) {
    RNG rng;
    for (const auto &cs :
         {*RGBColorSpace::sRGB, *RGBColorSpace::Rec2020, *RGBColorSpace::ACES2065_1}) {
        for (int i = 0; i < 100; ++i) {
            RGB rgb(rng.Uniform<Float>(), rng.Uniform<Float>(), rng.Uniform<Float>());
            rgb *= 10.f;
            RGBUnboundedSpectrum rs(cs, rgb);

            Float m = rs.MaxValue();
            Float sm = 0;
            for (Float lambda = 360; lambda <= 830; lambda += 1. / 16.)
                sm = std::max(sm, rs(lambda));
            EXPECT_LT(std::abs((sm - m) / sm), 1e-4)
                << "sampled " << sm << " MaxValue " << m << " for " << rs;
        }
    }
}